

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O0

bool YAML::convert<bool>::decode(Node *node,bool *rhs)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  string *psVar4;
  undefined1 *in_RSI;
  anon_struct_64_2_16624fb6 *name;
  anon_struct_64_2_16624fb6 *__end1;
  anon_struct_64_2_16624fb6 *__begin1;
  anon_struct_64_2_16624fb6 (*__range1) [4];
  undefined7 in_stack_fffffffffffffee8;
  byte in_stack_fffffffffffffeef;
  Node *in_stack_fffffffffffffef0;
  string *in_stack_fffffffffffffef8;
  anon_unknown_dwarf_d0fbf2 local_a0 [32];
  anon_unknown_dwarf_d0fbf2 local_80 [32];
  anon_struct_64_2_16624fb6 *local_60;
  anon_struct_64_2_16624fb6 *local_58;
  anon_struct_64_2_16624fb6 *local_50;
  anon_struct_64_2_16624fb6 *local_48;
  undefined1 local_40;
  undefined1 local_3f;
  allocator local_3e;
  allocator local_3d;
  undefined1 local_3c;
  allocator local_3b;
  allocator local_3a;
  undefined1 local_39;
  allocator local_38;
  allocator local_37;
  undefined1 local_36;
  allocator local_35 [20];
  allocator local_21;
  anon_struct_64_2_16624fb6 *local_20;
  undefined1 *local_18;
  
  local_18 = in_RSI;
  bVar1 = Node::IsScalar((Node *)0xef3604);
  if (bVar1) {
    if ((decode(YAML::Node_const&,bool&)::names == '\0') &&
       (iVar3 = __cxa_guard_acquire(&decode(YAML::Node_const&,bool&)::names), iVar3 != 0)) {
      local_40 = 1;
      local_20 = decode::names;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)decode::names,"y",&local_21);
      local_36 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&decode::names[0].falsename,"n",local_35);
      local_36 = 0;
      local_20 = (anon_struct_64_2_16624fb6 *)0x1187be0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(decode::names + 1),"yes",&local_37);
      local_39 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&decode::names[1].falsename,"no",&local_38);
      local_39 = 0;
      local_20 = (anon_struct_64_2_16624fb6 *)0x1187c20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(decode::names + 2),"true",&local_3a);
      local_3c = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&decode::names[2].falsename,"false",&local_3b);
      local_3c = 0;
      local_20 = (anon_struct_64_2_16624fb6 *)0x1187c60;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(decode::names + 3),"on",&local_3d);
      local_3f = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&decode::names[3].falsename,"off",&local_3e);
      local_3f = 0;
      local_40 = 0;
      std::allocator<char>::~allocator((allocator<char> *)&local_3e);
      std::allocator<char>::~allocator((allocator<char> *)&local_3d);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b);
      std::allocator<char>::~allocator((allocator<char> *)&local_3a);
      std::allocator<char>::~allocator((allocator<char> *)&local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_37);
      std::allocator<char>::~allocator((allocator<char> *)local_35);
      std::allocator<char>::~allocator((allocator<char> *)&local_21);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&decode(YAML::Node_const&,bool&)::names);
    }
    Node::Scalar_abi_cxx11_(in_stack_fffffffffffffef0);
    bVar1 = anon_unknown.dwarf_d0fbf2::IsFlexibleCase(in_stack_fffffffffffffef8);
    if (bVar1) {
      local_48 = decode::names;
      local_58 = (anon_struct_64_2_16624fb6 *)&decode(YAML::Node_const&,bool&)::names;
      for (local_50 = decode::names; local_50 != local_58; local_50 = local_50 + 1) {
        local_60 = local_50;
        psVar4 = Node::Scalar_abi_cxx11_(in_stack_fffffffffffffef0);
        anon_unknown.dwarf_d0fbf2::tolower(local_80,(int)psVar4);
        in_stack_fffffffffffffeef =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffef0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
        std::__cxx11::string::~string((string *)local_80);
        if ((in_stack_fffffffffffffeef & 1) != 0) {
          *local_18 = 1;
          return true;
        }
        psVar4 = Node::Scalar_abi_cxx11_(in_stack_fffffffffffffef0);
        anon_unknown.dwarf_d0fbf2::tolower(local_a0,(int)psVar4);
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffef0,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
        std::__cxx11::string::~string((string *)local_a0);
        if (_Var2) {
          *local_18 = 0;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool convert<bool>::decode(const Node& node, bool& rhs) {
  if (!node.IsScalar())
    return false;

  // we can't use iostream bool extraction operators as they don't
  // recognize all possible values in the table below (taken from
  // http://yaml.org/type/bool.html)
  static const struct {
    std::string truename, falsename;
  } names[] = {
      {"y", "n"},
      {"yes", "no"},
      {"true", "false"},
      {"on", "off"},
  };

  if (!IsFlexibleCase(node.Scalar()))
    return false;

  for (const auto& name : names) {
    if (name.truename == tolower(node.Scalar())) {
      rhs = true;
      return true;
    }

    if (name.falsename == tolower(node.Scalar())) {
      rhs = false;
      return true;
    }
  }

  return false;
}